

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O0

void Scl_LibertyStop(Scl_Tree_t *p,int fVerbose)

{
  long lVar1;
  abctime aVar2;
  undefined1 auVar3 [16];
  int fVerbose_local;
  Scl_Tree_t *p_local;
  
  if (fVerbose != 0) {
    lVar1 = (long)p->nContents + (long)p->nItermAlloc * 0x28;
    auVar3._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar3._0_8_ = lVar1;
    auVar3._12_4_ = 0x45300000;
    printf("Memory = %7.2f MB. ",
           (((auVar3._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) * 1.0) / 1048576.0);
    Abc_Print(1,"%s =","Time");
    aVar2 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar2 - p->clkStart) * 1.0) / 1000000.0);
  }
  if (p->pFileName != (char *)0x0) {
    free(p->pFileName);
    p->pFileName = (char *)0x0;
  }
  if (p->pContents != (char *)0x0) {
    free(p->pContents);
    p->pContents = (char *)0x0;
  }
  if (p->pItems != (Scl_Item_t *)0x0) {
    free(p->pItems);
    p->pItems = (Scl_Item_t *)0x0;
  }
  if (p->pError != (char *)0x0) {
    free(p->pError);
    p->pError = (char *)0x0;
  }
  if (p != (Scl_Tree_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Scl_LibertyStop( Scl_Tree_t * p, int fVerbose )
{
    if ( fVerbose )
    {
        printf( "Memory = %7.2f MB. ", 1.0 * (p->nContents + p->nItermAlloc * sizeof(Scl_Item_t))/(1<<20) );
        ABC_PRT( "Time", Abc_Clock() - p->clkStart );
    }
    ABC_FREE( p->pFileName );
    ABC_FREE( p->pContents );
    ABC_FREE( p->pItems );
    ABC_FREE( p->pError );
    ABC_FREE( p );
}